

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateDispatchLoaderDynamicCommandAssignment
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *commandName,
          string *aliasName,string *firstArg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t __n;
  undefined8 uVar3;
  char *pcVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (commandName,"vkGetInstanceProcAddr");
  if (iVar5 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  std::operator+(&local_50,"      ",commandName);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," = PFN_");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if (paVar1 == paVar7) {
    local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  local_90._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_90,(commandName->_M_dataplus)._M_p,commandName->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if (paVar1 == paVar7) {
    local_70.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  local_70._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,"( vkGet");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if (paVar1 == paVar7) {
    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_118._M_dataplus._M_p = (pointer)paVar1;
  }
  local_118._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (firstArg,"device");
  pcVar4 = "VkInstance";
  if (iVar5 == 0) {
    pcVar4 = "VkDevice";
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_118,pcVar4 + 2);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if (paVar1 == paVar7) {
    local_158.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_158.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_158._M_dataplus._M_p = (pointer)paVar1;
  }
  local_158._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_158,"ProcAddr( ");
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar7) {
    local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_f8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_f8,(firstArg->_M_dataplus)._M_p,firstArg->_M_string_length);
  paVar7 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == paVar8) {
    local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_d8._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_d8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,", \"");
  paVar8 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar9) {
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_b8._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_b8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b8,(commandName->_M_dataplus)._M_p,commandName->_M_string_length);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar10 = &pbVar6->field_2;
  if (paVar9 == paVar10) {
    local_138.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_138._M_dataplus._M_p = (pointer)paVar9;
  }
  local_138._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_138,"\" ) );\n");
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  pcVar2 = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar9) {
    uVar3 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_98->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar8) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar7) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __n = commandName->_M_string_length;
  if (__n == aliasName->_M_string_length) {
    if (__n == 0) {
      return __return_storage_ptr__;
    }
    iVar5 = bcmp((commandName->_M_dataplus)._M_p,(aliasName->_M_dataplus)._M_p,__n);
    if (iVar5 == 0) {
      return __return_storage_ptr__;
    }
  }
  std::operator+(&local_118,"      if ( !",aliasName);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_118," ) ");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar10 = &pbVar6->field_2;
  if (paVar9 == paVar10) {
    local_158.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_158.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_158._M_dataplus._M_p = (pointer)paVar9;
  }
  local_158._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_158,(aliasName->_M_dataplus)._M_p,aliasName->_M_string_length);
  local_f8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar9) {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_f8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f8," = ");
  local_d8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == paVar9) {
    local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_d8._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_d8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d8,(commandName->_M_dataplus)._M_p,commandName->_M_string_length);
  local_b8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar9) {
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_b8._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_b8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8,";\n");
  local_138._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar9) {
    local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_138._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138._M_dataplus._M_p,local_138._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar8) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar7) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateDispatchLoaderDynamicCommandAssignment( std::string const & commandName,
                                                                                std::string const & aliasName,
                                                                                std::string const & firstArg ) const
{
  if ( commandName == "vkGetInstanceProcAddr" )
  {
    // Don't overwite vkGetInstanceProcAddr with NULL.
    return "";
  }
  std::string str = "      " + commandName + " = PFN_" + commandName + "( vkGet" + ( ( firstArg == "device" ) ? "Device" : "Instance" ) + "ProcAddr( " +
                    firstArg + ", \"" + commandName + "\" ) );\n";
  // if this is an alias'ed function, use it as a fallback for the original one
  if ( commandName != aliasName )
  {
    str += "      if ( !" + aliasName + " ) " + aliasName + " = " + commandName + ";\n";
  }
  return str;
}